

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

char * Prs_ManWriteRange(Prs_Ntk_t *p,int RangeId,int fSlice)

{
  uint uVar1;
  uint uVar2;
  Vec_Str_t *p_00;
  char *pcVar3;
  
  if (RangeId == 0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    uVar1 = Hash_IntObjData0(p->vHash,RangeId);
    uVar2 = Hash_IntObjData1(p->vHash,RangeId);
  }
  p_00 = Abc_NamBuffer(p->pStrs);
  if ((fSlice != 0) && (uVar1 == uVar2)) {
    pcVar3 = Vec_StrPrintF(p_00,"[%d]",(ulong)uVar1);
    return pcVar3;
  }
  pcVar3 = Vec_StrPrintF(p_00,"[%d:%d]",(ulong)uVar1,(ulong)uVar2);
  return pcVar3;
}

Assistant:

static inline char * Prs_ManWriteRange( Prs_Ntk_t * p, int RangeId, int fSlice )
{
    int Left  = RangeId ? Hash_IntObjData0( p->vHash, RangeId ) : 0;
    int Right = RangeId ? Hash_IntObjData1( p->vHash, RangeId ) : 0;
    if ( Left == Right && fSlice )
        return Vec_StrPrintF( Abc_NamBuffer(p->pStrs), "[%d]", Right );
    else
        return Vec_StrPrintF( Abc_NamBuffer(p->pStrs), "[%d:%d]", Left, Right );
}